

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::SetAttributes
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attributes)

{
  PropertyAttributes attributes_00;
  int propertyKey;
  bool bVar1;
  PropertyId PVar2;
  BOOL BVar3;
  PropertyRecord *this_00;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  ScriptContext *scriptContext_00;
  uint32 local_4c;
  ScriptContext *pSStack_48;
  uint32 indexVal;
  ScriptContext *scriptContext;
  Type local_38;
  JavascriptLibrary *library;
  byte local_25;
  int i;
  PropertyAttributes attributes_local;
  Type TStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<2UL> *this_local;
  
  library._4_4_ = 0;
  local_25 = attributes;
  i = propertyId;
  TStack_20.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  while( true ) {
    if (this->propertyCount <= library._4_4_) {
      pSStack_48 = RecyclableObject::GetScriptContext((RecyclableObject *)TStack_20.ptr);
      bVar1 = DynamicObject::HasObjectArray((DynamicObject *)TStack_20.ptr);
      if ((bVar1) &&
         (BVar3 = ScriptContext::IsNumericPropertyId(pSStack_48,i,&local_4c), BVar3 != 0)) {
        this_local._4_4_ =
             DynamicTypeHandler::SetItemAttributes
                       (&this->super_DynamicTypeHandler,(DynamicObject *)TStack_20.ptr,local_4c,
                        local_25);
      }
      else {
        this_local._4_4_ = 1;
      }
      return this_local._4_4_;
    }
    this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                        (&this->descriptors[library._4_4_].Id);
    PVar2 = PropertyRecord::GetPropertyId(this_00);
    if (PVar2 == i) break;
    library._4_4_ = library._4_4_ + 1;
  }
  if ((this->descriptors[library._4_4_].field_1.Attributes & 8) != 0) {
    return 1;
  }
  this->descriptors[library._4_4_].field_1.Attributes =
       this->descriptors[library._4_4_].field_1.Attributes & 0xf8 | local_25 & 7;
  if ((this->descriptors[library._4_4_].field_1.Attributes & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties((DynamicObject *)TStack_20.ptr,false);
  }
  local_38.ptr = (GlobalObject *)RecyclableObject::GetLibrary((RecyclableObject *)TStack_20.ptr);
  JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
            ((JavascriptLibrary *)&scriptContext);
  this_01 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
            operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                       &scriptContext);
  propertyKey = i;
  attributes_00 = this->descriptors[library._4_4_].field_1.Attributes;
  scriptContext_00 = JavascriptLibrary::GetScriptContext((JavascriptLibrary *)local_38.ptr);
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
            (this_01,&this->super_DynamicTypeHandler,attributes_00,propertyKey,scriptContext_00);
  return 1;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    return true;
                }

                descriptors[i].Attributes = (descriptors[i].Attributes & ~PropertyDynamicTypeDefaults) | (attributes & PropertyDynamicTypeDefaults);
                if (descriptors[i].Attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptors[i].Attributes, propertyId, library->GetScriptContext());
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItemAttributes(instance, indexVal, attributes);
        }

        return true;
    }